

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

void trace_example(void)

{
  shared_ptr<spdlog::logger> logger;
  executor *this;
  executor *in_stack_fffffffffffffaa0;
  executor *this_00;
  executor local_558;
  undefined1 local_391 [481];
  executor local_1b0;
  
  spdlog::details::executor::executor(&local_1b0);
  spdlog::details::executor::~executor(in_stack_fffffffffffffaa0);
  this = (executor *)(local_391 + 0x31);
  spdlog::details::executor::executor(this);
  spdlog::details::executor::~executor(in_stack_fffffffffffffaa0);
  this_00 = (executor *)local_391;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_391 + 1),"file_logger",(allocator *)this_00);
  spdlog::get((string *)this);
  std::__cxx11::string::~string((string *)(local_391 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_391);
  spdlog::details::executor::executor(&local_558);
  spdlog::details::executor::~executor(this_00);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x10e952);
  return;
}

Assistant:

void trace_example()
{
    // trace from default logger
    SPDLOG_TRACE("Some trace message.. {} ,{}", 1, 3.23);
    // debug from default logger
    SPDLOG_DEBUG("Some debug message.. {} ,{}", 1, 3.23);

    // trace from logger object
    auto logger = spdlog::get("file_logger");
    SPDLOG_LOGGER_TRACE(logger, "another trace message");
}